

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

void legendre_function_q(int n,double x,double *cx)

{
  ulong uVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  if (ABS(x) < 1.0) {
    if (-1 < n) {
      dVar5 = log((x + 1.0) / (1.0 - x));
      *cx = dVar5 * 0.5;
      if (n != 0) {
        cx[1] = dVar5 * 0.5 * x + -1.0;
        iVar3 = -1;
        iVar4 = 3;
        for (uVar1 = 2; n + 1 != uVar1; uVar1 = uVar1 + 1) {
          cx[uVar1] = ((double)iVar4 * x * cx[uVar1 - 1] + (double)iVar3 * cx[uVar1 - 2]) /
                      (double)(int)uVar1;
          iVar3 = iVar3 + -1;
          iVar4 = iVar4 + 2;
        }
      }
    }
    return;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"LEGENDRE_FUNCTION_Q - Fatal error!\n");
  poVar2 = std::operator<<((ostream *)&std::cerr,"  Illegal input value of X = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,x);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cerr,"  But X must be between -1 and 1.\n");
  exit(1);
}

Assistant:

BURKHARDT_EXPORT
void legendre_function_q ( int n, double x, double cx[] )

//****************************************************************************80
//
//  Purpose:
//
//    LEGENDRE_FUNCTION_Q evaluates the Legendre Q functions.
//
//  Differential equation:
//
//    (1-X*X) Y'' - 2 X Y' + N (N+1) = 0
//
//  First terms:
//
//    Q(0,X) = 0.5 * log((1+X)/(1-X))
//    Q(1,X) = Q(0,X)*X - 1
//    Q(2,X) = Q(0,X)*(3*X*X-1)/4 - 1.5*X
//    Q(3,X) = Q(0,X)*(5*X*X*X-3*X)/4 - 2.5*X^2 + 2/3
//    Q(4,X) = Q(0,X)*(35*X^4-30*X^2+3)/16 - 35/8 * X^3 + 55/24 * X
//    Q(5,X) = Q(0,X)*(63*X^5-70*X^3+15*X)/16 - 63/8*X^4 + 49/8*X^2 - 8/15
//
//  Recursion:
//
//    Q(0) = 0.5 * log ( (1+X) / (1-X) )
//    Q(1) = 0.5 * X * log ( (1+X) / (1-X) ) - 1.0
//
//    Q(N) = ( (2*N-1) * X * Q(N-1) - (N-1) * Q(N-2) ) / N
//
//  Restrictions:
//
//    -1 < X < 1
//
//  Special values:
//
//    Note that the Legendre function Q(N,X) is equal to the
//    associated Legendre function of the second kind,
//    Q(N,M,X) with M = 0.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order function to evaluate.
//
//    Input, double X, the point at which the functions are to be
//    evaluated.  X must satisfy -1 < X < 1.
//
//    Output, double CX[N+1], the values of the first N+1 Legendre
//    functions at the point X.
//
{
  int i;
//
//  Check the value of X.
//
  if ( x <= -1.0 || 1.0 <= x )
  {
    std::cerr << "\n";
    std::cerr << "LEGENDRE_FUNCTION_Q - Fatal error!\n";
    std::cerr << "  Illegal input value of X = " << x << "\n";
    std::cerr << "  But X must be between -1 and 1.\n";
    exit ( 1 );
  }

  if ( n < 0 )
  {
    return;
  }

  cx[0] = 0.5 * log ( ( 1.0 + x ) / ( 1.0 - x ) );

  if ( n == 0 )
  {
    return;
  }

  cx[1] = x * cx[0] - 1.0;

  for ( i = 2; i <= n; i++ )
  {
    cx[i] = ( double( 2 * i - 1 ) * x * cx[i-1] 
            + double(   - i + 1 ) *     cx[i-2] ) 
            / double(i);
  }

  return;
}